

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrmpack.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer puVar1;
  uint *puVar2;
  _func_void_ptr_void_ptr_cgltf_size *p_Var3;
  cgltf_buffer_view *pcVar4;
  _func_cgltf_result_cgltf_memory_options_ptr_cgltf_file_options_ptr_char_ptr_cgltf_size_ptr_void_ptr_ptr
  *p_Var5;
  size_t __n;
  cgltf_buffer *pcVar6;
  pointer pfVar7;
  pointer pcVar8;
  bool bVar9;
  double dVar10;
  ulong target_index_count;
  undefined8 uVar11;
  int iVar12;
  cgltf_result cVar13;
  int iVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Mesh *pMVar15;
  cgltf_size cVar16;
  char **ppcVar17;
  ulong uVar18;
  size_t sVar19;
  size_t sVar20;
  cgltf_skin *pcVar21;
  cgltf_accessor **ppcVar22;
  byte bVar23;
  cgltf_primitive *pcVar24;
  pointer ppMVar25;
  long lVar26;
  cgltf_mesh **ppcVar27;
  cgltf_data *data_00;
  size_type sVar28;
  char *pcVar29;
  int iVar30;
  cgltf_size index;
  cgltf_accessor *pcVar31;
  cgltf_size *pcVar32;
  cgltf_size cVar33;
  cgltf_mesh *pcVar34;
  bool bVar35;
  char *local_c78;
  allocator local_c69;
  char **local_c68;
  undefined8 uStack_c60;
  vector<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_> meshes;
  uint32_t json_size;
  cgltf_skin *local_c38;
  undefined8 uStack_c30;
  ulong local_c20;
  ulong local_c18;
  int local_c0c [3];
  undefined8 local_c00;
  double local_bf8;
  string out_bin;
  vector<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_> local_bd0;
  string out_json;
  undefined1 *local_b98 [2];
  undefined1 local_b88 [16];
  undefined1 *local_b78 [2];
  undefined1 local_b68 [16];
  undefined1 *local_b58 [2];
  undefined1 local_b48 [16];
  undefined1 *local_b38 [2];
  undefined1 local_b28 [16];
  cgltf_options write_options;
  cgltf_options options;
  ios_base local_9e0 [272];
  ofstream out_st;
  filebuf local_8c8 [240];
  ios_base local_7d8 [264];
  cgltf_data *data;
  streambuf local_6c0 [504];
  stringstream outss_bin;
  ostream local_4b8 [112];
  ios_base aiStack_448 [264];
  stringstream outss_json;
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream inss_json;
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  bVar9 = 1 < argc;
  local_c68 = argv;
  if (argc < 2) {
    local_c18 = 0;
    local_bf8 = 1.0;
    bVar35 = false;
    pcVar21 = (cgltf_skin *)0x0;
    local_c78 = (char *)0x0;
    bVar23 = 0;
    iVar14 = 0;
  }
  else {
    local_c20 = CONCAT44(local_c20._4_4_,0x3f800000);
    iVar30 = 1;
    local_c0c[1] = 0;
    local_c0c[2] = 0;
    local_c00 = 0;
    local_c78 = (char *)0x0;
    local_c38 = (cgltf_skin *)0x0;
    iVar14 = 0;
    local_c18 = 0;
    do {
      pcVar29 = local_c68[iVar30];
      iVar12 = strcmp(pcVar29,"-si");
      if (((iVar12 == 0) && (iVar12 = iVar30 + 1, iVar12 < argc)) &&
         ((int)*local_c68[iVar12] - 0x30U < 10)) {
        dVar10 = atof(local_c68[iVar12]);
        local_c20 = CONCAT44(local_c20._4_4_,(float)dVar10);
        bVar35 = true;
        iVar30 = iVar12;
      }
      else {
        iVar12 = strcmp(pcVar29,"-sa");
        bVar35 = true;
        if (iVar12 == 0) {
          local_c18 = CONCAT71((int7)(CONCAT44(extraout_var,iVar12) >> 8),1);
        }
        else {
          iVar12 = strcmp(pcVar29,"-i");
          if (((iVar12 == 0) && (iVar12 = iVar30 + 1, iVar12 < argc)) &&
             (local_c38 == (cgltf_skin *)0x0)) {
            local_c38 = (cgltf_skin *)local_c68[iVar12];
            iVar30 = iVar12;
          }
          else {
            iVar12 = strcmp(pcVar29,"-o");
            if (((iVar12 == 0) && (iVar12 = iVar30 + 1, iVar12 < argc)) &&
               (local_c78 == (char *)0x0)) {
              local_c78 = local_c68[iVar12];
              iVar30 = iVar12;
            }
            else {
              iVar12 = strcmp(pcVar29,"-v");
              if (iVar12 == 0) {
                iVar14 = 1;
              }
              else {
                iVar12 = strcmp(pcVar29,"-vv");
                if (iVar12 == 0) {
                  iVar14 = 2;
                }
                else {
                  iVar12 = strcmp(pcVar29,"-h");
                  bVar35 = true;
                  if (iVar12 == 0) {
                    local_c00 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar12) >> 8),1);
                  }
                  else if (*pcVar29 == '-') {
                    bVar35 = false;
                    fprintf(_stderr,"Unrecognized option %s\n",pcVar29);
                    local_c0c[1] = 1;
                    local_c0c[2] = 0;
                  }
                }
              }
            }
          }
        }
      }
      if (!bVar35) break;
      iVar30 = iVar30 + 1;
      bVar9 = iVar30 < argc;
    } while (iVar30 < argc);
    bVar35 = iVar14 != 0;
    local_bf8 = (double)(float)local_c20;
    iVar14 = (int)local_c0c._4_8_;
    bVar23 = (byte)local_c00;
    pcVar21 = local_c38;
  }
  if (bVar9) {
    return iVar14;
  }
  if (bVar35 && argc == 2) {
    getVersion_abi_cxx11_();
    iVar14 = 0;
    printf("vrmpack %s\n",options._0_8_);
    ppMVar25 = (pointer)options._0_8_;
    if ((cgltf_memory_options *)options._0_8_ == &options.memory) {
      return 0;
    }
    goto LAB_0010d455;
  }
  if ((local_c78 == (char *)0x0 || pcVar21 == (cgltf_skin *)0x0) || (bVar23 & 1) != 0) {
    main_cold_1();
    return options.type;
  }
  meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  options.file.release = (_func_void_cgltf_memory_options_ptr_cgltf_file_options_ptr_void_ptr *)0x0;
  options.file.user_data = (void *)0x0;
  options.memory.user_data = (void *)0x0;
  options.file.read =
       (_func_cgltf_result_cgltf_memory_options_ptr_cgltf_file_options_ptr_char_ptr_cgltf_size_ptr_void_ptr_ptr
        *)0x0;
  options.memory.alloc = (_func_void_ptr_void_ptr_cgltf_size *)0x0;
  options.memory.free = (_func_void_void_ptr_void_ptr *)0x0;
  options.type = cgltf_file_type_invalid;
  options._4_4_ = 0;
  options.json_token_count = 0;
  data = (cgltf_data *)0x0;
  cVar13 = cgltf_parse_file(&options,(char *)pcVar21,&data);
  data_00 = data;
  if (cVar13 == cgltf_result_success) {
    cVar13 = cgltf_load_buffers(&options,data,(char *)pcVar21);
    if (cVar13 != cgltf_result_success) {
      cgltf_free(data_00);
      pcVar29 = "Failed to load buffers from %s\n";
      goto LAB_0010d49f;
    }
    if (data_00->meshes_count != 0) {
      uVar18 = 0;
      do {
        local_c20 = uVar18;
        if (data_00->meshes[uVar18].primitives_count != 0) {
          pcVar34 = data_00->meshes + uVar18;
          ppcVar17 = (char **)0x0;
          do {
            pcVar24 = pcVar34->primitives + (long)ppcVar17;
            local_c68 = ppcVar17;
            pMVar15 = (Mesh *)operator_new(0x88);
            memset(pMVar15,0,0x88);
            (pMVar15->name)._M_dataplus._M_p = (pointer)&(pMVar15->name).field_2;
            (pMVar15->name)._M_string_length = 0;
            (pMVar15->name).field_2._M_local_buf[0] = '\0';
            (pMVar15->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pMVar15->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pMVar15->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pMVar15->positions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pMVar15->positions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pMVar15->positions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pMVar15->mesh = pcVar34;
            pcVar29 = pcVar34->name;
            _out_st = pMVar15;
            strlen(pcVar29);
            std::__cxx11::string::_M_replace((ulong)pMVar15,0,(char *)0x0,(ulong)pcVar29);
            pMVar15 = _out_st;
            _out_st->primitive = pcVar24;
            cVar33 = data_00->nodes_count;
            if (cVar33 == 0) {
              pcVar21 = (cgltf_skin *)0x0;
            }
            else {
              ppcVar27 = &data_00->nodes->mesh;
              do {
                pcVar21 = (cgltf_skin *)ppcVar27[-1];
                if ((((pcVar21 == (cgltf_skin *)0x0) || (*ppcVar27 == (cgltf_mesh *)0x0)) ||
                    (pcVar29 = (*ppcVar27)->name, pcVar29 == (char *)0x0)) ||
                   (iVar14 = strcmp(pcVar29,pcVar34->name), iVar14 != 0)) {
                  bVar9 = true;
                }
                else {
                  bVar9 = false;
                  local_c38 = pcVar21;
                }
                pcVar21 = local_c38;
                if (!bVar9) goto LAB_0010c9bd;
                ppcVar27 = ppcVar27 + 0x1e;
                cVar33 = cVar33 - 1;
              } while (cVar33 != 0);
              pcVar21 = (cgltf_skin *)0x0;
            }
LAB_0010c9bd:
            pMVar15->skin = pcVar21;
            pcVar31 = pcVar24->indices;
            pMVar15->indices_accessor = pcVar31;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      (&pMVar15->indices,pcVar31->count);
            pcVar31 = pcVar24->indices;
            cVar33 = pcVar31->count;
            if (cVar33 != 0) {
              puVar1 = (pMVar15->indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              index = 0;
              do {
                cVar16 = cgltf_accessor_read_index(pcVar31,index);
                puVar1[index] = (uint)cVar16;
                index = index + 1;
              } while (cVar33 != index);
            }
            pMVar15 = _out_st;
            cVar33 = _out_st->primitive->attributes_count;
            if (cVar33 == 0) {
              pcVar31 = (cgltf_accessor *)0x0;
            }
            else {
              ppcVar22 = &_out_st->primitive->attributes->data;
              pcVar31 = (cgltf_accessor *)0x0;
              do {
                if (*(cgltf_attribute_type *)(ppcVar22 + -1) == cgltf_attribute_type_position) {
                  pcVar31 = *ppcVar22;
                }
                ppcVar22 = ppcVar22 + 4;
                cVar33 = cVar33 - 1;
              } while (cVar33 != 0);
            }
            if (pcVar31 != (cgltf_accessor *)0x0) {
              sVar28 = pcVar31->count * 3;
              std::vector<float,_std::allocator<float>_>::resize(&_out_st->positions,sVar28);
              cgltf_accessor_unpack_floats
                        (pcVar31,(pMVar15->positions).
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start,sVar28);
              pMVar15->vertex_count = pcVar31->count;
              pMVar15->vertex_positions_stride = pcVar31->stride;
            }
            if (meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<VRM::Mesh*,std::allocator<VRM::Mesh*>>::
              _M_realloc_insert<VRM::Mesh*const&>
                        ((vector<VRM::Mesh*,std::allocator<VRM::Mesh*>> *)&meshes,
                         (iterator)
                         meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Mesh **)&out_st);
            }
            else {
              *meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish = _out_st;
              meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            ppcVar17 = (char **)((long)local_c68 + 1);
          } while (ppcVar17 < (char **)pcVar34->primitives_count);
        }
        uVar18 = local_c20 + 1;
      } while (uVar18 < data_00->meshes_count);
    }
  }
  else {
    pcVar29 = "Failed to parse file %s\n";
LAB_0010d49f:
    data_00 = (cgltf_data *)0x0;
    fprintf(_stderr,pcVar29,pcVar21);
  }
  if (data_00 == (cgltf_data *)0x0) {
    iVar14 = 4;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&inss_json);
    sVar19 = strlen(local_c78);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_c78,sVar19);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".in.json",8);
    write_options.file.release =
         (_func_void_cgltf_memory_options_ptr_cgltf_file_options_ptr_void_ptr *)0x0;
    write_options.file.user_data = (void *)0x0;
    write_options.memory.user_data = (void *)0x0;
    write_options.file.read =
         (_func_cgltf_result_cgltf_memory_options_ptr_cgltf_file_options_ptr_char_ptr_cgltf_size_ptr_void_ptr_ptr
          *)0x0;
    write_options.memory.alloc = (_func_void_ptr_void_ptr_cgltf_size *)0x0;
    write_options.memory.free = (_func_void_void_ptr_void_ptr *)0x0;
    write_options.type = cgltf_file_type_invalid;
    write_options._4_4_ = 0;
    write_options.json_token_count = 0;
    std::__cxx11::stringbuf::str();
    cgltf_write_file(&write_options,(char *)options._0_8_,data_00);
    if ((cgltf_memory_options *)options._0_8_ != &options.memory) {
      operator_delete((void *)options._0_8_);
    }
    if (meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar18 = 0;
      do {
        pMVar15 = meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar18];
        sVar28 = (long)(pMVar15->indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pMVar15->indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        local_c68 = (char **)((double)(sVar28 / 3) * local_bf8);
        uStack_c60 = 0;
        local_c38 = (cgltf_skin *)((double)local_c68 - 9.223372036854776e+18);
        uStack_c30 = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&options,sVar28,
                   (allocator_type *)&data);
        target_index_count =
             ((long)(double)local_c38 & (long)(double)local_c68 >> 0x3f | (long)(double)local_c68) *
             3;
        puVar2 = (pMVar15->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar20 = meshopt_simplify((uint *)options._0_8_,puVar2,
                                  (long)(pMVar15->indices).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >>
                                  2,(pMVar15->positions).
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start,pMVar15->vertex_count,
                                  pMVar15->vertex_positions_stride,target_index_count,0.01,
                                  (float *)0x0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&options,sVar20);
        uVar11 = options._0_8_;
        puVar2 = (pMVar15->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar1 = (pMVar15->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        p_Var3 = (_func_void_ptr_void_ptr_cgltf_size *)
                 (pMVar15->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pMVar15->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)options._0_8_;
        (pMVar15->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)options.json_token_count;
        (pMVar15->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)options.memory.alloc;
        options.memory.alloc = p_Var3;
        if (((local_c18 & 1) != 0) &&
           (sVar20 = (long)(options.json_token_count - options._0_8_) >> 2,
           target_index_count < sVar20)) {
          options._0_8_ = puVar2;
          options.json_token_count = (cgltf_size)puVar1;
          sVar20 = meshopt_simplifySloppy
                             (puVar2,(uint *)uVar11,sVar20,
                              (pMVar15->positions).super__Vector_base<float,_std::allocator<float>_>
                              ._M_impl.super__Vector_impl_data._M_start,pMVar15->vertex_count,
                              pMVar15->vertex_positions_stride,target_index_count,0.1,(float *)0x0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&options,sVar20);
          puVar2 = (pMVar15->indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar1 = (pMVar15->indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          p_Var3 = (_func_void_ptr_void_ptr_cgltf_size *)
                   (pMVar15->indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          (pMVar15->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)options._0_8_;
          (pMVar15->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)options.json_token_count;
          (pMVar15->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)options.memory.alloc;
          options.memory.alloc = p_Var3;
        }
        options.json_token_count = (cgltf_size)puVar1;
        options._0_8_ = puVar2;
        if (options._0_8_ != 0) {
          operator_delete((void *)options._0_8_);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < (ulong)((long)meshes.
                                      super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)meshes.
                                      super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    std::vector<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>::vector(&local_bd0,&meshes);
    options.memory.free = (_func_void_void_ptr_void_ptr *)&options.json_token_count;
    options.json_token_count = options.json_token_count & 0xffffffff00000000;
    options.memory.alloc = (_func_void_ptr_void_ptr_cgltf_size *)0x0;
    options.file.read =
         (_func_cgltf_result_cgltf_memory_options_ptr_cgltf_file_options_ptr_char_ptr_cgltf_size_ptr_void_ptr_ptr
          *)0x0;
    pcVar21 = (cgltf_skin *)options.memory.free;
    options.memory.user_data = options.memory.free;
    if (local_bd0.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_bd0.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppMVar25 = local_bd0.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        pMVar15 = *ppMVar25;
        pcVar31 = pMVar15->indices_accessor;
        puVar1 = (pMVar15->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar19 = (long)(pMVar15->indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar1;
        pcVar31->count = (long)sVar19 >> 2;
        pcVar4 = pcVar31->buffer_view;
        pcVar4->size = sVar19;
        memcpy((void *)((long)pcVar4->buffer->data + pcVar4->offset),puVar1,sVar19);
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&options,&pMVar15->indices_accessor->buffer_view->buffer_index);
        ppMVar25 = ppMVar25 + 1;
        pcVar21 = (cgltf_skin *)options.memory.free;
      } while (ppMVar25 !=
               local_bd0.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    while (pcVar21 != (cgltf_skin *)&options.json_token_count) {
      p_Var5 = ((cgltf_file_options *)&pcVar21->inverse_bind_matrices)->read;
      pcVar6 = data_00->buffers + (long)p_Var5;
      local_c38 = pcVar21;
      local_c68 = (char **)malloc(data_00->buffers[(long)p_Var5].size);
      cVar33 = data_00->buffer_views_count;
      if (cVar33 == 0) {
        sVar19 = 0;
      }
      else {
        pcVar32 = &data_00->buffer_views->offset;
        sVar19 = 0;
        do {
          if ((_func_cgltf_result_cgltf_memory_options_ptr_cgltf_file_options_ptr_char_ptr_cgltf_size_ptr_void_ptr_ptr
               *)pcVar32[0x10] == p_Var5) {
            __n = pcVar32[1];
            memcpy((void *)((long)local_c68 + sVar19),(void *)((long)pcVar6->data + *pcVar32),__n);
            *pcVar32 = sVar19;
            sVar19 = sVar19 + (__n + 3 & 0xfffffffffffffffc);
          }
          pcVar32 = pcVar32 + 0x12;
          cVar33 = cVar33 - 1;
        } while (cVar33 != 0);
      }
      ppcVar17 = local_c68;
      pcVar6->size = sVar19;
      memcpy(pcVar6->data,local_c68,sVar19);
      free(ppcVar17);
      pcVar21 = (cgltf_skin *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_c38);
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)&options);
    if (local_bd0.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_bd0.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&outss_json);
    std::__cxx11::stringstream::stringstream((stringstream *)&outss_bin);
    sVar19 = strlen(local_c78);
    std::__ostream_insert<char,std::char_traits<char>>(local_330,local_c78,sVar19);
    std::__ostream_insert<char,std::char_traits<char>>(local_330,".json",5);
    sVar19 = strlen(local_c78);
    std::__ostream_insert<char,std::char_traits<char>>(local_4b8,local_c78,sVar19);
    std::__ostream_insert<char,std::char_traits<char>>(local_4b8,".bin",4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    cgltf_write_file(&write_options,out_json._M_dataplus._M_p,data_00);
    local_b58[0] = local_b48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b58,out_bin._M_dataplus._M_p,
               out_bin._M_dataplus._M_p + out_bin._M_string_length);
    std::ofstream::ofstream(&options);
    std::ofstream::open((char *)&options,(_Ios_Openmode)local_b58[0]);
    if (data_00->buffers_count != 0) {
      lVar26 = 0;
      uVar18 = 0;
      do {
        pcVar6 = data_00->buffers;
        std::ostream::write((char *)&options,(long)&pcVar6->size + lVar26);
        std::ostream::write((char *)&options,0x11e168);
        std::ostream::write((char *)&options,*(long *)((long)&pcVar6->data + lVar26));
        uVar18 = uVar18 + 1;
        lVar26 = lVar26 + 0x38;
      } while (uVar18 < data_00->buffers_count);
    }
    std::ofstream::close();
    uVar11 = __filebuf;
    pMVar15 = _VTT;
    options._0_8_ = _VTT;
    *(undefined8 *)
     ((long)&options.type +
     (long)_VTT[-1].positions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start) = __filebuf;
    std::filebuf::~filebuf((filebuf *)&options.json_token_count);
    std::ios_base::~ios_base(local_9e0);
    if (local_b58[0] != local_b48) {
      operator_delete(local_b58[0]);
    }
    std::__cxx11::string::string((string *)local_b38,local_c78,&local_c69);
    local_b78[0] = local_b68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b78,out_json._M_dataplus._M_p,
               out_json._M_dataplus._M_p + out_json._M_string_length);
    local_b98[0] = local_b88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b98,out_bin._M_dataplus._M_p,
               out_bin._M_dataplus._M_p + out_bin._M_string_length);
    std::ifstream::ifstream(&options,(string *)local_b78,_S_bin);
    std::ifstream::ifstream(&data,(string *)local_b98,_S_bin);
    std::ofstream::ofstream(&out_st,(string *)local_b38,_S_trunc|_S_bin);
    std::istream::seekg((long)&options,_S_beg);
    json_size = std::istream::tellg();
    std::istream::seekg((long)&options,_S_beg);
    std::istream::seekg((long)&data,_S_beg);
    iVar14 = std::istream::tellg();
    std::istream::seekg((long)&data,_S_beg);
    local_c0c[0] = json_size + iVar14 + 0x14;
    std::ostream::write((char *)&out_st,0x11e16c);
    std::ostream::write((char *)&out_st,0x11e170);
    std::ostream::write((char *)&out_st,(long)local_c0c);
    std::ostream::write((char *)&out_st,(long)&json_size);
    std::ostream::write((char *)&out_st,0x11e174);
    std::ostream::operator<<((ostream *)&out_st,(streambuf *)&options.memory);
    std::ostream::operator<<((ostream *)&out_st,local_6c0);
    std::ofstream::close();
    _out_st = pMVar15;
    *(undefined8 *)
     (&out_st +
     (long)pMVar15[-1].positions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start) = uVar11;
    std::filebuf::~filebuf(local_8c8);
    std::ios_base::~ios_base(local_7d8);
    std::ifstream::~ifstream(&data);
    std::ifstream::~ifstream(&options);
    if (local_b98[0] != local_b88) {
      operator_delete(local_b98[0]);
    }
    if (local_b78[0] != local_b68) {
      operator_delete(local_b78[0]);
    }
    if (local_b38[0] != local_b28) {
      operator_delete(local_b38[0]);
    }
    if (meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar18 = 0;
      do {
        pMVar15 = meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar18];
        if (pMVar15 != (Mesh *)0x0) {
          pfVar7 = (pMVar15->positions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (pfVar7 != (pointer)0x0) {
            operator_delete(pfVar7);
          }
          puVar1 = (pMVar15->indices).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (puVar1 != (pointer)0x0) {
            operator_delete(puVar1);
          }
          pcVar8 = (pMVar15->name)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar8 != &(pMVar15->name).field_2) {
            operator_delete(pcVar8);
          }
          operator_delete(pMVar15);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < (ulong)((long)meshes.
                                      super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)meshes.
                                      super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    cgltf_free(data_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out_bin._M_dataplus._M_p != &out_bin.field_2) {
      operator_delete(out_bin._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out_json._M_dataplus._M_p != &out_json.field_2) {
      operator_delete(out_json._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&outss_bin);
    std::ios_base::~ios_base(aiStack_448);
    std::__cxx11::stringstream::~stringstream((stringstream *)&outss_json);
    std::ios_base::~ios_base(aiStack_2c0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&inss_json);
    std::ios_base::~ios_base(aiStack_138);
    iVar14 = 0;
  }
  ppMVar25 = meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (meshes.super__Vector_base<VRM::Mesh_*,_std::allocator<VRM::Mesh_*>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return iVar14;
  }
LAB_0010d455:
  operator_delete(ppMVar25);
  return iVar14;
}

Assistant:

int main(int argc, char** argv)
{
	Settings settings = defaults();

	const char* input = 0;
	const char* output = 0;
	bool help = false;

	std::vector<const char*> testinputs;

	for (int i = 1; i < argc; ++i)
	{
		const char* arg = argv[i];

		if (strcmp(arg, "-si") == 0 && i + 1 < argc && isdigit(argv[i + 1][0]))
		{
			settings.simplify_threshold = float(atof(argv[++i]));
		}
		else if (strcmp(arg, "-sa") == 0)
		{
			settings.simplify_aggressive = true;
		}
		else if (strcmp(arg, "-i") == 0 && i + 1 < argc && !input)
		{
			input = argv[++i];
		}
		else if (strcmp(arg, "-o") == 0 && i + 1 < argc && !output)
		{
			output = argv[++i];
		}
		else if (strcmp(arg, "-v") == 0)
		{
			settings.verbose = 1;
		}
		else if (strcmp(arg, "-vv") == 0)
		{
			settings.verbose = 2;
		}
		else if (strcmp(arg, "-h") == 0)
		{
			help = true;
		}
		else if (arg[0] == '-')
		{
			fprintf(stderr, "Unrecognized option %s\n", arg);
			return 1;
		}
	}

	// shortcut for vrmpack -v
	if (settings.verbose && argc == 2)
	{
		printf("vrmpack %s\n", getVersion().c_str());
		return 0;
	}

	if (!input || !output || help)
	{
		fprintf(stderr, "vrmpack %s\n", getVersion().c_str());
		fprintf(stderr, "Usage: vrmpack [options] -i input -o output\n");

		if (help)
		{
			fprintf(stderr, "\nBasics:\n");
			fprintf(stderr, "\t-i file: input file to process, .vrm\n");
			fprintf(stderr, "\t-o file: output file path, .vrm\n");
			fprintf(stderr, "\nSimplification:\n");
			fprintf(stderr, "\t-si R: simplify meshes to achieve the ratio R (default: 1; R should be between 0 and 1)\n");
			fprintf(stderr, "\t-sa: aggressively simplify to the target ratio disregarding quality\n");
			fprintf(stderr, "\nMiscellaneous:\n");
			fprintf(stderr, "\t-v: verbose output (print version when used without other options)\n");
			fprintf(stderr, "\t-h: display this help and exit\n");
		}
		else
		{
			fprintf(stderr, "\nBasics:\n");
			fprintf(stderr, "\t-i file: input file to process, .vrm\n");
			fprintf(stderr, "\t-o file: output file path, .vrm\n");
			fprintf(stderr, "\t-si R: simplify meshes to achieve the ratio R (default: 1; R should be between 0 and 1)\n");
			fprintf(stderr, "\nRun vrmpack -h to display a full list of options\n");
		}

		return 1;
	}

	return vrmpack(input, output, settings);
}